

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O0

char * __thiscall
ODDLParser::OpenDDLParser::parseStructureBody(OpenDDLParser *this,char *in,char *end,bool *error)

{
  char *__s;
  bool bVar1;
  DDLNode *pDVar2;
  ostream *this_00;
  char *in_00;
  allocator<char> local_89;
  string local_88;
  size_t local_68;
  size_t numValues;
  size_t numRefs;
  Value *values;
  DataArrayList *dtArrayList;
  Reference *refs;
  size_t arrayLen;
  bool *pbStack_30;
  ValueType type;
  bool *error_local;
  char *end_local;
  char *in_local;
  OpenDDLParser *this_local;
  
  pbStack_30 = error;
  error_local = (bool *)end;
  end_local = in;
  in_local = (char *)this;
  bVar1 = isNumeric<char>(*in);
  if ((!bVar1) && (bVar1 = isCharacter<char>(*end_local), !bVar1)) {
    end_local = end_local + 1;
  }
  end_local = lookForNextToken<char>(end_local,error_local);
  arrayLen._4_4_ = ddl_none;
  refs = (Reference *)0x0;
  end_local = parsePrimitiveDataType
                        (end_local,error_local,(ValueType *)((long)&arrayLen + 4),(size_t *)&refs);
  if (arrayLen._4_4_ == ddl_none) {
    end_local = parseNextNode(this,end_local,error_local);
  }
  else {
    end_local = lookForNextToken<char>(end_local,error_local);
    if (*end_local == *Grammar::OpenBracketToken) {
      dtArrayList = (DataArrayList *)0x0;
      values = (Value *)0x0;
      numRefs = 0;
      if (refs == (Reference *)0x1) {
        numValues = 0;
        local_68 = 0;
        end_local = parseDataList(end_local,error_local,arrayLen._4_4_,(Value **)&numRefs,&local_68,
                                  (Reference **)&dtArrayList,&numValues);
        pDVar2 = top(this);
        setNodeValues(pDVar2,(Value *)numRefs);
        pDVar2 = top(this);
        setNodeReferences(pDVar2,(Reference *)dtArrayList);
      }
      else if (refs < (Reference *)0x2) {
        this_00 = std::operator<<((ostream *)&std::cerr,"0 for array is invalid.");
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        *pbStack_30 = true;
      }
      else {
        end_local = parseDataArrayList(end_local,error_local,arrayLen._4_4_,
                                       (DataArrayList **)&values);
        pDVar2 = top(this);
        setNodeDataArrayList(pDVar2,(DataArrayList *)values);
      }
    }
    in_00 = lookForNextToken<char>(end_local,error_local);
    __s = Grammar::CloseBracketToken;
    end_local = in_00;
    if (*in_00 != '}') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,__s,&local_89);
      logInvalidTokenError(in_00,&local_88,this->m_logCallback);
      std::__cxx11::string::~string((string *)&local_88);
      std::allocator<char>::~allocator(&local_89);
      return (char *)0x0;
    }
  }
  return end_local;
}

Assistant:

char *OpenDDLParser::parseStructureBody( char *in, char *end, bool &error ) {
    if( !isNumeric( *in ) && !isCharacter( *in ) ) {
        ++in;
    }

    in = lookForNextToken( in, end );
    Value::ValueType type( Value::ddl_none );
    size_t arrayLen( 0 );
    in = OpenDDLParser::parsePrimitiveDataType( in, end, type, arrayLen );
    if( Value::ddl_none != type ) {
        // parse a primitive data type
        in = lookForNextToken( in, end );
        if( *in == Grammar::OpenBracketToken[ 0 ] ) {
            Reference *refs( ddl_nullptr );
            DataArrayList *dtArrayList( ddl_nullptr );
            Value *values( ddl_nullptr );
            if( 1 == arrayLen ) {
                size_t numRefs( 0 ), numValues( 0 );
                in = parseDataList( in, end, type, &values, numValues, &refs, numRefs );
                setNodeValues( top(), values );
                setNodeReferences( top(), refs );
            } else if( arrayLen > 1 ) {
                in = parseDataArrayList( in, end, type, &dtArrayList );
                setNodeDataArrayList( top(), dtArrayList );
            } else {
                std::cerr << "0 for array is invalid." << std::endl;
                error = true;
            }
        }

        in = lookForNextToken( in, end );
        if( *in != '}' ) {
            logInvalidTokenError( in, std::string( Grammar::CloseBracketToken ), m_logCallback );
            return ddl_nullptr;
        } else {
            //in++;
        }
    } else {
        // parse a complex data type
        in = parseNextNode( in, end );
    }

    return in;
}